

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>,_true>
__thiscall
duckdb::JoinFilterPushdownInfo::GetLocalState
          (JoinFilterPushdownInfo *this,JoinFilterGlobalState *gstate)

{
  _Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false> __p;
  pointer in_RAX;
  type args;
  __uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  *this_00;
  unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>
  *in_RDX;
  _Head_base<0UL,_duckdb::LocalUngroupedAggregateState_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  make_uniq<duckdb::JoinFilterLocalState>();
  args = unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>
         ::operator*(in_RDX);
  make_uniq<duckdb::LocalUngroupedAggregateState,duckdb::GlobalUngroupedAggregateState&>
            ((duckdb *)&local_18,args);
  this_00 = (__uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
             *)unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>,_true>
               ::operator->((unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>,_true>
                             *)this);
  __p._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (LocalUngroupedAggregateState *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  ::reset(this_00,__p._M_head_impl);
  ::std::
  unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  ::~unique_ptr((unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
                 *)&local_18);
  return (unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
          )(unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
            )this;
}

Assistant:

unique_ptr<JoinFilterLocalState> JoinFilterPushdownInfo::GetLocalState(JoinFilterGlobalState &gstate) const {
	auto result = make_uniq<JoinFilterLocalState>();
	result->local_aggregate_state = make_uniq<LocalUngroupedAggregateState>(*gstate.global_aggregate_state);
	return result;
}